

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,BinaryOperator *b)

{
  Op OVar1;
  int iVar2;
  Constant *pCVar3;
  pool_ptr<soul::AST::Constant> rhsConst;
  pool_ptr<soul::AST::Constant> lhsConst;
  Type operandType;
  pool_ptr<soul::AST::Constant> local_90;
  pool_ptr<soul::AST::Constant> local_88;
  Type local_80;
  Type local_68;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,b);
  throwErrorIfNotReadableValue((b->rhs).object);
  iVar2 = (*(b->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[9])(b);
  if ((char)iVar2 != '\0') {
    return;
  }
  throwErrorIfNotReadableValue((b->lhs).object);
  AST::BinaryOperator::getOperandType(&local_68,b);
  if (local_68.category == invalid) {
    throwErrorForBinaryOperatorTypes(b);
  }
  if ((b->operation & ~divide) != lessThan) goto LAB_0022c3ce;
  (*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_88);
  (*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_90);
  if (local_88.object == (Constant *)0x0) {
    iVar2 = 0;
LAB_0022c387:
    if (local_90.object != (Constant *)0x0) {
      OVar1 = b->operation;
      (*(((b->lhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_80);
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_90);
      iVar2 = BinaryOp::getResultOfComparisonWithBoundedType(OVar1,&local_80,&pCVar3->value);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
    }
  }
  else {
    if (local_90.object != (Constant *)0x0) goto LAB_0022c3ce;
    OVar1 = b->operation;
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_88);
    (*(((b->rhs).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_80);
    iVar2 = BinaryOp::getResultOfComparisonWithBoundedType(OVar1,&pCVar3->value,&local_80);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
    if (local_88.object == (Constant *)0x0) goto LAB_0022c387;
  }
  if (iVar2 != 0) {
    if (iVar2 < 1) {
      Errors::comparisonAlwaysFalse<>();
    }
    else {
      Errors::comparisonAlwaysTrue<>();
    }
    AST::Context::throwError
              (&(b->super_Expression).super_Statement.super_ASTObject.context,&local_50,false);
  }
LAB_0022c3ce:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_68.structure);
  return;
}

Assistant:

void visit (AST::BinaryOperator& b) override
        {
            super::visit (b);

            throwErrorIfNotReadableValue (b.rhs);

            if (b.isOutputEndpoint())
                return;

            throwErrorIfNotReadableValue (b.lhs);

            auto operandType = b.getOperandType();

            if (! operandType.isValid())
                throwErrorForBinaryOperatorTypes (b);

            if (BinaryOp::isComparisonOperator (b.operation))
            {
                auto lhsConst = b.lhs->getAsConstant();
                auto rhsConst = b.rhs->getAsConstant();
                int result = 0;

                if (lhsConst != nullptr && rhsConst == nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, lhsConst->value, b.rhs->getResultType());

                if (lhsConst == nullptr && rhsConst != nullptr)
                    result = BinaryOp::getResultOfComparisonWithBoundedType (b.operation, b.lhs->getResultType(), rhsConst->value);

                if (result != 0)
                    b.context.throwError (result > 0 ? Errors::comparisonAlwaysTrue()
                                                     : Errors::comparisonAlwaysFalse());
            }
        }